

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O3

string * __thiscall
cfd::core::
JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Serialize(string *__return_storage_ptr__,
         JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this)

{
  pointer pbVar1;
  pointer pcVar2;
  _Node *p_Var3;
  char *pcVar4;
  bool bVar5;
  pointer pbVar6;
  _List_node_base *p_Var7;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  string item_result;
  UniValue json_value;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  string local_c8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  UniValue local_88;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = (char *)0x0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_e0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_e0;
  local_e0._M_impl._M_node._M_size = 0;
  pbVar6 = (this->
           super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->
           super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._M_impl._M_node.super__List_node_base._M_prev =
       local_e0._M_impl._M_node.super__List_node_base._M_next;
  if (pbVar6 != pbVar1) {
    do {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      pcVar2 = (pbVar6->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar2,pcVar2 + pbVar6->_M_string_length);
      UniValue::UniValue(&local_88,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      UniValue::write_abi_cxx11_((UniValue *)local_a8,(int)&local_88,(void *)0x0,0);
      UniValue::~UniValue(&local_88);
      p_Var3 = ::std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          &local_e0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a8);
      ::std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
      local_e0._M_impl._M_node._M_size = local_e0._M_impl._M_node._M_size + 1;
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar1);
    pcVar4 = (char *)__return_storage_ptr__->_M_string_length;
  }
  ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar4,0x61824b);
  bVar5 = true;
  p_Var7 = (_List_node_base *)&local_e0;
  while (p_Var7 = (((_List_impl *)&p_Var7->_M_next)->_M_node).super__List_node_base._M_next,
        p_Var7 != (_List_node_base *)&local_e0) {
    if (!bVar5) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    bVar5 = false;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var7[1]._M_next);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Serialize() const {
    std::string result;
    std::list<std::string> str_list;
    for (const auto& element : *this) {
      std::string item_result = ConvertToString(element);
      str_list.push_back(item_result);
    }

    result = "[";
    bool is_first = true;
    for (const auto& item : str_list) {
      if (!is_first) {
        result += ",";
      }
      result += item;
      is_first = false;
    }
    result += "]";

    return result;
  }